

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

bool __thiscall
ON_PolyEdgeCurve::Insert(ON_PolyEdgeCurve *this,int segment_index,ON_PolyEdgeSegment *new_segment)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_PolyEdgeSegment *pOVar4;
  double *pdVar5;
  int i;
  ON_Interval d;
  
  (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x17])(this,1);
  if (segment_index < 1) {
    if (segment_index == 0) {
      bVar2 = Prepend(this,new_segment);
      return bVar2;
    }
  }
  else {
    bVar2 = ON_PolyCurve::Insert(&this->super_ON_PolyCurve,segment_index,(ON_Curve *)new_segment);
    if (bVar2) {
      for (; iVar3 = ON_PolyCurve::Count(&this->super_ON_PolyCurve), segment_index < iVar3;
          segment_index = segment_index + 1) {
        pOVar4 = SegmentCurve(this,segment_index);
        d = ON_PolyCurve::SegmentDomain(&this->super_ON_PolyCurve,segment_index);
        pdVar5 = ON_Interval::operator[](&d,0);
        dVar1 = *pdVar5;
        pdVar5 = ON_Interval::operator[](&d,1);
        (*(pOVar4->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(dVar1,*pdVar5,pOVar4);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PolyEdgeCurve::Insert( 
         int segment_index,
         ON_PolyEdgeSegment* new_segment
         )
{
  DestroyRuntimeCache();
  bool rc = false;
  if ( segment_index > 0 )
  {
    //m_is_closed_helper = 0;
    rc = ON_PolyCurve::Insert(segment_index,new_segment);
    if ( rc )
    {
      int i;
      for ( i = segment_index; i < Count(); i++ )
      {
        ON_PolyEdgeSegment* seg = SegmentCurve(i);
        ON_Interval d = SegmentDomain(i);
        seg->SetDomain(d[0],d[1]);
      }
    }
  }
  else if ( segment_index == 0 )
    rc = Prepend(new_segment);
  return rc;
}